

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O0

void __thiscall BackwardPass::ProcessInlineeEnd(BackwardPass *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar3;
  Instr *instr_local;
  BackwardPass *this_local;
  
  bVar2 = IsPrePass(this);
  if (!bVar2) {
    if (this->tag == BackwardPhase) {
      IR::Instr::IterateArgInstrs<BackwardPass::ProcessInlineeEnd(IR::Instr*)::__0>
                (instr,(anon_class_8_1_8991fb9c)this);
    }
    else if (this->tag == DeadStorePhase) {
      this_00 = Func::GetJITFunctionBody(instr->m_func);
      bVar2 = JITTimeFunctionBody::UsesArgumentsObject(this_00);
      if ((bVar2) && (bVar2 = Func::IsStackArgsEnabled(instr->m_func), !bVar2)) {
        Func::DisableCanDoInlineArgOpt(instr->m_func);
      }
      if ((*(uint *)&instr->m_func->field_0x240 >> 1 & 1) != 0) {
        if (instr->m_func->frameInfo == (InlineeFrameInfo *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x2079,"(instr->m_func->frameInfo)","instr->m_func->frameInfo");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        InlineeFrameInfo::IterateSyms<BackwardPass::ProcessInlineeEnd(IR::Instr*)::__1>
                  (instr->m_func->frameInfo,(anon_class_8_1_8991fb9c_for_callback)this,false);
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::ProcessInlineeEnd(IR::Instr* instr)
{
    if (this->IsPrePass())
    {
        return;
    }
    if (this->tag == Js::BackwardPhase)
    {
        // Commenting out to allow for argument length and argument[constant] optimization
        // Will revisit in phase two
        /*if (!GlobOpt::DoInlineArgsOpt(instr->m_func))
        {
            return;
        }*/

        // This adds a use for function sym as part of InlineeStart & all the syms referenced by the args.
        // It ensure they do not get cleared from the copy prop sym map.
        instr->IterateArgInstrs([=](IR::Instr* argInstr){
            if (argInstr->GetSrc1()->IsRegOpnd())
            {
                this->currentBlock->upwardExposedUses->Set(argInstr->GetSrc1()->AsRegOpnd()->m_sym->m_id);
            }
            return false;
        });
    }
    else if (this->tag == Js::DeadStorePhase)
    {
        if (instr->m_func->GetJITFunctionBody()->UsesArgumentsObject() && !instr->m_func->IsStackArgsEnabled())
        {
            instr->m_func->DisableCanDoInlineArgOpt();
        }

        if (instr->m_func->m_hasInlineArgsOpt)
        {
            Assert(instr->m_func->frameInfo);
            instr->m_func->frameInfo->IterateSyms([=](StackSym* argSym)
            {
                this->currentBlock->upwardExposedUses->Set(argSym->m_id);
            });
        }
    }
}